

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:107:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:108:7)>
::getImpl(TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:107:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:108:7)>
          *this,ExceptionOrValue *output)

{
  int *params_1;
  ExceptionOr<int> depResult;
  int local_2e4;
  ExceptionOr<int> local_2e0;
  ExceptionOrValue local_178;
  char local_18;
  int local_14;
  
  local_178.exception.ptr.isSet = false;
  local_18 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_178);
  if (local_178.exception.ptr.isSet == true) {
    params_1 = (this->errorHandler).line;
    if ((*params_1 != local_178.exception.ptr.field_1.value.line) && (Debug::minSeverity < 3)) {
      local_2e4 = local_178.exception.ptr.field_1.value.line;
      Debug::log<char_const(&)[41],int&,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x6c,ERROR,"\"failed: expected \" \"(line) == (e.getLine())\", line, e.getLine()",
                 (char (*) [41])"failed: expected (line) == (e.getLine())",params_1,&local_2e4);
    }
    local_2e0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_2e0.value.ptr.isSet = true;
    local_2e0.value.ptr.field_1.value = 0x159;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_2e0);
  }
  else {
    if (local_18 != '\x01') goto LAB_001bbae0;
    local_2e0.value.ptr.field_1.value = local_14 + 1;
    local_2e0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_2e0.value.ptr.isSet = true;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_2e0);
  }
  if (local_2e0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2e0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_001bbae0:
  if (local_178.exception.ptr.isSet == true) {
    Exception::~Exception(&local_178.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }